

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::ensure_builtin(CompilerMSL *this,StorageClass storage,BuiltIn builtin)

{
  ulong uVar1;
  __hashtable *__h;
  Bitset *pBVar2;
  __node_gen_type __node_gen;
  BuiltIn local_24;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_20;
  
  if (storage == StorageClassOutput) {
    pBVar2 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins;
  }
  else if (storage == StorageClassInput) {
    pBVar2 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  }
  else {
    pBVar2 = (Bitset *)0x0;
  }
  if (pBVar2 != (Bitset *)0x0) {
    local_20 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)CONCAT44(local_20._4_4_,builtin);
    if (builtin < 0x40) {
      uVar1 = 1L << ((byte)builtin & 0x3f) & pBVar2->lower;
    }
    else {
      uVar1 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(pBVar2->higher)._M_h,(key_type *)&local_20);
    }
    if (uVar1 == 0) {
      local_24 = builtin;
      if (builtin < 0x40) {
        pBVar2->lower = pBVar2->lower | 1L << ((byte)builtin & 0x3f);
      }
      else {
        local_20 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&pBVar2->higher;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_20,&local_24);
      }
      Compiler::force_recompile((Compiler *)this);
    }
  }
  return;
}

Assistant:

void CompilerMSL::ensure_builtin(spv::StorageClass storage, spv::BuiltIn builtin)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	// At this point, the specified builtin variable must have already been declared in the entry point.
	// If not, mark as active and force recompile.
	if (active_builtins != nullptr && !active_builtins->get(builtin))
	{
		active_builtins->set(builtin);
		force_recompile();
	}
}